

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

djg_mesh * djgm_load_cap(float angle,int slices,int stacks)

{
  float fVar1;
  djgm_vertex *pdVar2;
  djg_mesh *pdVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  uVar6 = stacks + 2;
  uVar10 = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
  }
  iVar5 = -2;
  if (-2 < slices) {
    iVar5 = slices;
  }
  lVar8 = 0x38;
  for (; uVar7 = uVar4, lVar9 = lVar8, uVar10 != iVar5 + 2; uVar10 = uVar10 + 1) {
    while (uVar7 != 0) {
      pdVar2 = pdVar3->vertexv;
      fVar13 = *(float *)((long)pdVar2 + lVar9 + -0x28);
      fVar1 = *(float *)((long)pdVar2 + lVar9 + -0x24);
      *(float *)((long)pdVar2 + lVar9 + -0x28) = fVar1;
      fVar1 = (fVar1 + fVar1) * 3.1415927;
      *(float *)((long)pdVar2 + lVar9 + -0x24) = fVar13;
      fVar13 = fVar13 * angle;
      *(undefined8 *)((long)pdVar2 + lVar9 + -0x20) = 0;
      fVar11 = sinf(fVar13);
      fVar12 = cosf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -0x38) = fVar12 * fVar11;
      fVar11 = sinf(fVar13);
      fVar12 = sinf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -0x34) = fVar12 * fVar11;
      fVar11 = cosf(fVar13);
      *(float *)((long)pdVar2 + lVar9 + -0x30) = fVar11;
      fVar11 = cosf(fVar13);
      fVar12 = cosf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -0x18) = fVar12 * fVar11;
      fVar11 = cosf(fVar13);
      fVar12 = sinf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -0x14) = fVar12 * fVar11;
      fVar13 = sinf(fVar13);
      *(float *)((long)pdVar2 + lVar9 + -0x10) = -fVar13;
      fVar13 = sinf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -8) = -fVar13;
      fVar13 = cosf(fVar1);
      *(float *)((long)pdVar2 + lVar9 + -4) = fVar13;
      *(undefined4 *)((long)&(pdVar2->p).x + lVar9) = 0;
      uVar7 = uVar7 - 1;
      lVar9 = lVar9 + 0x40;
    }
    lVar8 = lVar8 + (long)(int)uVar6 * 0x40;
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *djgm_load_cap(float angle, int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float theta = v->st.s * angle;
        float phi = v->st.t * 2.f * M_PI;
        float tmp = v->st.s;

        v->st.s = v->st.t;
        v->st.t = tmp;
        v->st.p = 0;
        v->st.q = 0;

        v->p.x = sin(theta) * cos(phi);
        v->p.y = sin(theta) * sin(phi);
        v->p.z = cos(theta);

        v->dpds.x = cos(theta) * cos(phi);
        v->dpds.y = cos(theta) * sin(phi);
        v->dpds.z = -sin(theta);

        v->dpdt.x = -sin(phi);
        v->dpdt.y = cos(phi);
        v->dpdt.z = 0.f;
    }

    return mesh;
}